

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O1

void __thiscall InterpreterTestSuite::InitContext(InterpreterTestSuite *this,TestContext *ctx)

{
  shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>_> *psVar1;
  AssertHelperData *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_01;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  char *message;
  AssertionResult gtest_ar_2;
  Error result;
  string configFile;
  Error error;
  _Any_data local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  undefined1 local_138 [32];
  MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  local_118;
  Matcher<const_ot::commissioner::Config_&> local_e0;
  undefined8 local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  string local_b8;
  undefined8 local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  TestContext *local_88;
  Error local_80;
  Error local_58;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"./tmp/config","");
  psVar1 = (shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>_> *)
           ((long)&local_118.matchers_.
                   super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                   .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
                   super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
                   _M_head_impl + 8);
  local_118.function_mocker_ =
       (FunctionMocker<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
        *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"{\"ThreadSMRoot\": \"./tmp\"}","");
  ot::commissioner::WriteFile(&local_58,(string *)&local_118,&local_b8);
  if (local_118.function_mocker_ !=
      (FunctionMocker<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
       *)psVar1) {
    operator_delete(local_118.function_mocker_);
  }
  local_158._0_4_ = local_58.mCode;
  local_138._0_8_ = (ulong)(uint)local_138._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
            ((internal *)&local_118,"error.GetCode()","ErrorCode::kNone",
             (ErrorCode *)local_158._M_pod_data,(ErrorCode *)local_138);
  pp_Var3 = local_118.matchers_.
            super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
            .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
            super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
            _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase;
  if ((char)local_118.function_mocker_ == '\0') {
    testing::Message::Message((Message *)&local_158);
    if (local_118.matchers_.
        super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
        .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
        super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
        _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase ==
        (_func_int **)0x0) {
      p_Var4 = (_func_int *)0x308a15;
    }
    else {
      p_Var4 = *local_118.matchers_.
                super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
                super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
                _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x68,(char *)p_Var4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)&local_158);
LAB_001ac6a8:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_unused._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*local_158._M_unused._M_object + 8))();
    }
    pp_Var3 = local_118.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
              .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
              super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
              _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase;
    if (local_118.matchers_.
        super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
        .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
        super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
        _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase ==
        (_func_int **)0x0) goto LAB_001ac938;
    if ((_func_int **)
        *local_118.matchers_.
         super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
         .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
         super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
         _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase !=
        local_118.matchers_.
        super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
        .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
        super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
        _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase + 2) {
      operator_delete(*local_118.matchers_.
                       super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                       .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
                       super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>
                       ._M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>.
                       _vptr_MatcherBase);
    }
  }
  else {
    if (local_118.matchers_.
        super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
        .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
        super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
        _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase !=
        (_func_int **)0x0) {
      if ((_func_int **)
          *local_118.matchers_.
           super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
           .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
           super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
           _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase !=
          local_118.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
          .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
          super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
          _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase + 2) {
        operator_delete(*local_118.matchers_.
                         super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                         .
                         super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>
                         .
                         super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>
                         ._M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>.
                         _vptr_MatcherBase);
      }
      operator_delete(pp_Var3);
    }
    local_158._M_unused._M_object =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    testing::internal::CmpHelperNE<std::shared_ptr<CommissionerAppMock>,decltype(nullptr)>
              ((internal *)&local_118,"ctx.mDefaultCommissionerObject","nullptr",
               &ctx->mDefaultCommissionerObject,(void **)&local_158);
    if ((char)local_118.function_mocker_ == '\0') {
      testing::Message::Message((Message *)&local_158);
      if (local_118.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
          .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
          super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
          _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase ==
          (_func_int **)0x0) {
        p_Var4 = (_func_int *)0x308a15;
      }
      else {
        p_Var4 = *local_118.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                  .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
                  super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
                  _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase
        ;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_138,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x6a,(char *)p_Var4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)&local_158);
      goto LAB_001ac6a8;
    }
    if (local_118.matchers_.
        super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
        .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
        super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
        _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase !=
        (_func_int **)0x0) {
      if ((_func_int **)
          *local_118.matchers_.
           super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
           .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
           super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
           _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase !=
          local_118.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
          .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
          super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
          _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase + 2) {
        operator_delete(*local_118.matchers_.
                         super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                         .
                         super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>
                         .
                         super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>
                         ._M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>.
                         _vptr_MatcherBase);
      }
      operator_delete(local_118.matchers_.
                      super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                      .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
                      super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>
                      ._M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>.
                      _vptr_MatcherBase);
    }
    local_138._8_8_ = operator_new(8);
    (((MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)local_138._8_8_)->
    super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
         (_func_int **)&PTR__MatcherDescriberInterface_003a48d0;
    this_00 = (AssertHelperData *)(local_138 + 0x10);
    local_138._0_8_ = &PTR__MatcherBase_0039fc90;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>&>const*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00,
               (MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
               local_138._8_8_);
    local_138._0_8_ = &PTR__MatcherBase_0039fc48;
    local_e0.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)operator_new(8);
    ((local_e0.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
         (_func_int **)&PTR__MatcherDescriberInterface_003a4988;
    local_e0.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
         (_func_int **)&PTR__MatcherBase_0039fcf8;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<testing::MatcherInterface<ot::commissioner::Config_const&>const*>
              (&local_e0.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
                super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               local_e0.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
    local_e0.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
         (_func_int **)&PTR__MatcherBase_0039fcb0;
    CommissionerAppStaticExpecter::gmock_Create
              (&local_118,&ctx->mCommissionerAppStaticExpecter,
               (Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)local_138,&local_e0)
    ;
    testing::internal::GetWithoutMatchers();
    this_01 = testing::internal::
              MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
              ::InternalExpectedAt
                        (&local_118,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                         ,0x6c,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
    paVar2 = &local_80.mMessage.field_2;
    local_80.mCode = kNone;
    local_80.mMessage._M_string_length = 0;
    local_80.mMessage.field_2._M_local_buf[0] = '\0';
    local_80.mMessage._M_dataplus._M_p = (pointer)paVar2;
    testing::Return<ot::commissioner::Error>((testing *)&local_c8,&local_80);
    local_98 = local_c8;
    local_90 = local_c0;
    if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_c0->_M_use_count = local_c0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_c0->_M_use_count = local_c0->_M_use_count + 1;
      }
    }
    local_88 = ctx;
    testing::internal::DoAllAction::operator_cast_to_Action
              ((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                *)&local_158,(DoAllAction *)&local_98);
    testing::internal::
    TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
    ::WillOnce(this_01,(Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                        *)&local_158);
    if ((code *)local_148._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_148._M_allocated_capacity)(&local_158,&local_158,3);
    }
    if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
    }
    if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.mMessage._M_dataplus._M_p != paVar2) {
      operator_delete(local_80.mMessage._M_dataplus._M_p);
    }
    local_118.matchers_.
    super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
    .
    super__Head_base<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_false>
    ._M_head_impl.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.
    _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0039fc90;
    if (local_118.matchers_.
        super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
        .
        super__Head_base<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_false>
        ._M_head_impl.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.impl_.
        super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_118.matchers_.
                 super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                 .
                 super__Head_base<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_false>
                 ._M_head_impl.
                 super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.impl_.
                 super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    local_118.matchers_.
    super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
    .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
    super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>._M_head_impl.
    super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
         (_func_int **)&PTR__MatcherBase_0039fcf8;
    if (local_118.matchers_.
        super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
        .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
        super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
        _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
        super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_118.matchers_.
                 super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                 .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
                 super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
                 _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
                 super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    local_e0.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
         (_func_int **)&PTR__MatcherBase_0039fcf8;
    if (local_e0.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
        super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
                 super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    local_138._0_8_ = &PTR__MatcherBase_0039fc90;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._16_8_);
    }
    local_158._M_unused._M_object = &local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"./tmp/config","");
    message = "";
    local_138._0_8_ = this_00;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"","");
    ot::commissioner::Interpreter::Init
              ((Error *)&local_118,&ctx->mInterpreter,(string *)&local_158,(string *)local_138);
    if ((AssertHelperData *)local_138._0_8_ != this_00) {
      operator_delete((void *)local_138._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_unused._0_8_ != &local_148) {
      operator_delete(local_158._M_unused._M_object);
    }
    local_138._0_4_ = local_118.function_mocker_._0_4_;
    local_e0.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
         (_func_int **)
         ((ulong)local_e0.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase &
         0xffffffff00000000);
    testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
              ((internal *)local_158._M_pod_data,"result.GetCode()","ErrorCode::kNone",
               (ErrorCode *)local_138,(ErrorCode *)&local_e0);
    if (local_158._M_pod_data[0] == '\0') {
      testing::Message::Message((Message *)local_138);
      if ((undefined8 *)local_158._8_8_ != (undefined8 *)0x0) {
        message = *(char **)local_158._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x72,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)local_138);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
      if ((AssertHelperData *)local_138._0_8_ != (AssertHelperData *)0x0) {
        (**(code **)(*(_func_int **)local_138._0_8_ + 8))();
      }
      if ((undefined8 *)local_158._8_8_ != (undefined8 *)0x0) {
        if (*(undefined8 **)local_158._8_8_ != (undefined8 *)(local_158._8_8_ + 0x10)) {
          operator_delete(*(undefined8 **)local_158._8_8_);
        }
        operator_delete((void *)local_158._8_8_);
      }
    }
    else {
      if ((undefined8 *)local_158._8_8_ != (undefined8 *)0x0) {
        if (*(undefined8 **)local_158._8_8_ != (undefined8 *)(local_158._8_8_ + 0x10)) {
          operator_delete(*(undefined8 **)local_158._8_8_);
        }
        operator_delete((void *)local_158._8_8_);
      }
      ctx->mRegistry =
           (ctx->mInterpreter).mRegistry.
           super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_158._0_2_ = 0x3031;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                 &(((ctx->mInterpreter).mJobManager.
                    super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mDefaultConf).mPSKc,&local_158);
    }
    pp_Var3 = local_118.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
              .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
              super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
              _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase;
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        local_118.matchers_.
        super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
        .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
        super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
        _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase ==
        (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        ((long)&local_118.matchers_.
                super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
                super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
                _M_head_impl + 0x10U)) goto LAB_001ac938;
  }
  operator_delete(pp_Var3);
LAB_001ac938:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.mMessage._M_dataplus._M_p != &local_58.mMessage.field_2) {
    operator_delete(local_58.mMessage._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void InitContext(TestContext &ctx)
    {
        // Minimum test setup: create config file
        const std::string configFile = "./tmp/config";
        auto              error      = WriteFile("{\"ThreadSMRoot\": \"./tmp\"}", configFile);
        ASSERT_EQ(error.GetCode(), ErrorCode::kNone);

        ASSERT_NE(ctx.mDefaultCommissionerObject, nullptr);

        EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
            .WillOnce(
                DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = ctx.mDefaultCommissionerObject; }),
                      Return(Error{})));

        auto result = ctx.mInterpreter.Init("./tmp/config", "");
        ASSERT_EQ(result.GetCode(), ErrorCode::kNone);

        ctx.mRegistry = ctx.mInterpreter.mRegistry.get();

        // Add formal default PSKc
        ctx.mInterpreter.mJobManager->mDefaultConf.mPSKc = {'1', '0'};
    }